

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.h
# Opt level: O0

void __thiscall
Js::IndexPropertyDescriptor::IndexPropertyDescriptor
          (IndexPropertyDescriptor *this,PropertyAttributes attributes,Var getter,Var setter)

{
  Var setter_local;
  Var getter_local;
  PropertyAttributes attributes_local;
  IndexPropertyDescriptor *this_local;
  
  this->Attributes = attributes;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Getter,getter);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Setter,setter);
  return;
}

Assistant:

IndexPropertyDescriptor(PropertyAttributes attributes = PropertyDynamicTypeDefaults,
            Var getter = NULL, Var setter = NULL)
            : Attributes(attributes), Getter(getter), Setter(setter)
        {
        }